

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O1

vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> * __thiscall
HBF::expand(vector<HBF::maze_s,_std::allocator<HBF::maze_s>_> *__return_storage_ptr__,HBF *this,
           maze_s state)

{
  double dVar1;
  double dVar2;
  iterator __position;
  double dVar3;
  double dVar4;
  int iVar5;
  double __x;
  maze_s state2;
  maze_s local_40;
  
  (__return_storage_ptr__->super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dVar3 = (double)((int)state.g + 1);
  iVar5 = -0x28;
  do {
    iVar5 = iVar5 + 5;
    dVar1 = this->SPEED;
    dVar2 = this->LENGTH;
    dVar4 = tan((double)iVar5 * 0.017453292519943295);
    dVar1 = dVar4 * (dVar1 / dVar2) + state.theta;
    __x = (double)(~-(ulong)(0.0 < dVar1) & (ulong)dVar1 |
                  (ulong)(dVar1 + 6.283185307179586) & -(ulong)(0.0 < dVar1));
    dVar1 = this->SPEED;
    dVar2 = cos(__x);
    dVar2 = dVar2 * dVar1 + state.x;
    dVar1 = this->SPEED;
    dVar4 = sin(__x);
    local_40.y = dVar4 * dVar1 + state.y;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    local_40.g = dVar3;
    local_40.x = dVar2;
    local_40.theta = __x;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<HBF::maze_s,std::allocator<HBF::maze_s>>::_M_realloc_insert<HBF::maze_s_const&>
                ((vector<HBF::maze_s,std::allocator<HBF::maze_s>> *)__return_storage_ptr__,
                 __position,&local_40);
    }
    else {
      (__position._M_current)->y = local_40.y;
      (__position._M_current)->theta = __x;
      (__position._M_current)->g = dVar3;
      (__position._M_current)->x = dVar2;
      (__return_storage_ptr__->super__Vector_base<HBF::maze_s,_std::allocator<HBF::maze_s>_>).
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  } while (iVar5 < 0x23);
  return __return_storage_ptr__;
}

Assistant:

vector<HBF::maze_s> HBF::expand(HBF::maze_s state) {
    int g = state.g;
    double x = state.x;
    double y = state.y;
    double theta = state.theta;

    int g2 = g + 1;
    vector<HBF::maze_s> next_states;
    for (double delta_i = -35; delta_i < 40; delta_i += 5) {

        double delta = M_PI / 180.0 * delta_i;
        double omega = SPEED / LENGTH * tan(delta);
        double theta2 = theta + omega;
        if (theta2 > 0) {
            theta2 += 2 * M_PI;
        }
        double x2 = x + SPEED * cos(theta2);
        double y2 = y + SPEED * sin(theta2);
        HBF::maze_s state2;
        state2.g = g2;
        state2.x = x2;
        state2.y = y2;
        state2.theta = theta2;
        next_states.push_back(state2);

    }
    return next_states;
}